

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentalProcessPdu.cpp
# Opt level: O2

int __thiscall DIS::EnvironmentalProcessPdu::getMarshalledSize(EnvironmentalProcessPdu *this)

{
  pointer pEVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  Environment listElement;
  
  iVar2 = SyntheticEnvironmentFamilyPdu::getMarshalledSize
                    (&this->super_SyntheticEnvironmentFamilyPdu);
  iVar3 = EntityID::getMarshalledSize(&this->_environementalProcessID);
  iVar4 = EntityType::getMarshalledSize(&this->_environmentType);
  iVar2 = iVar4 + iVar3 + iVar2 + 5;
  lVar6 = 8;
  uVar5 = 0;
  while( true ) {
    pEVar1 = (this->_environmentRecords).
             super__Vector_base<DIS::Environment,_std::allocator<DIS::Environment>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->_environmentRecords).
                       super__Vector_base<DIS::Environment,_std::allocator<DIS::Environment>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pEVar1) / 0x18) <= uVar5)
    break;
    listElement._vptr_Environment = (_func_int **)&PTR__Environment_001b0ed8;
    listElement._padding2 = *(uchar *)((long)&pEVar1->_environmentType + lVar6);
    listElement._8_8_ = *(undefined8 *)((long)&pEVar1->_vptr_Environment + lVar6);
    iVar3 = Environment::getMarshalledSize(&listElement);
    iVar2 = iVar2 + iVar3;
    Environment::~Environment(&listElement);
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + 0x18;
  }
  return iVar2;
}

Assistant:

int EnvironmentalProcessPdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = SyntheticEnvironmentFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + _environementalProcessID.getMarshalledSize();  // _environementalProcessID
   marshalSize = marshalSize + _environmentType.getMarshalledSize();  // _environmentType
   marshalSize = marshalSize + 1;  // _modelType
   marshalSize = marshalSize + 1;  // _environmentStatus
   marshalSize = marshalSize + 1;  // _numberOfEnvironmentRecords
   marshalSize = marshalSize + 2;  // _sequenceNumber

   for(unsigned long long idx=0; idx < _environmentRecords.size(); idx++)
   {
        Environment listElement = _environmentRecords[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}